

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

ObjectPtr __thiscall ICM::DefFunc::Calc::NumCall::func(NumCall *this,DataList *list)

{
  long lVar1;
  Object *pOVar2;
  int iVar3;
  undefined4 extraout_var;
  int in_ECX;
  long *in_RDX;
  long *extraout_RDX;
  long lVar4;
  DataList *pDVar5;
  void *in_R8;
  
  pDVar5 = list;
  iVar3 = Object::clone(*(Object **)in_RDX[1],(__fn *)list,in_RDX,in_ECX,in_R8);
  lVar1 = *in_RDX;
  if (lVar1 != 1) {
    lVar4 = 1;
    do {
      if (list[1]._capacity == 0) {
        std::__throw_bad_function_call();
        pOVar2 = (Object *)*extraout_RDX;
        pDVar5->_capacity = pDVar5->_capacity - (long)pOVar2;
        return (ObjectPtr)pOVar2;
      }
      pDVar5 = (DataList *)((_func_int **)CONCAT44(extraout_var,iVar3))[1];
      (*(code *)list[1]._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                (&list->_data,pDVar5,*(undefined8 *)(*(long *)(in_RDX[1] + lVar4 * 8) + 8));
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  (this->super_FI)._vptr_FuncInitObject = (_func_int **)CONCAT44(extraout_var,iVar3);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					Object *tmp = list.front()->clone();
					for (auto i : Range<size_t>(1, list.size()))
						fp(tmp->dat<T_Number>(), list[i]->dat<T_Number>());
					return ObjectPtr(tmp);
				}